

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.h
# Opt level: O0

char * __thiscall ArgParser::ArgIterator::getstr(ArgIterator *this)

{
  range_error *prVar1;
  char *pcVar2;
  char local_25 [13];
  ArgIterator *local_18;
  ArgIterator *this_local;
  
  local_18 = this;
  if (this->i == this->argc) {
    prVar1 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(prVar1,"arg out of range");
    __cxa_throw(prVar1,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  if (((this->isoption & 1U) == 0) || ((this->longmatch & 1U) != 0)) {
    if ((this->longmatch & 1U) != 0) {
      local_25[0] = '=';
      pcVar2 = std::find<char_const*,char>(this->p,this->pend,local_25);
      this->p = pcVar2;
      if (this->p != this->pend) {
        return this->p + 1;
      }
      operator++(this);
    }
  }
  else {
    this->p = this->p + 2;
    if (*this->p == '\0') {
      operator++(this);
    }
  }
  if (this->i != this->argc) {
    return this->p;
  }
  prVar1 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(prVar1,"arg out of range");
  __cxa_throw(prVar1,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

const char *getstr()
        {
            if (i==argc)
                throw std::range_error("arg out of range");
            if (isoption && !longmatch) {
                // skips '-' + optionchar
                p += 2;
                if (*p==0) {
                    //  -opt <space> argument
                    operator++();
                }

                // -opt<argument>
            }
            else if (longmatch) {
                // long match need not match the full word.
                p = std::find(p, pend, '=');
                if (p!=pend) {
                    // --longopt '=' argument
                    return p+1;
                }

                // --longopt <space> argument
                operator++();
            }

            // check again if we are out of options
            if (i==argc)
                throw std::range_error("arg out of range");
            return p;
        }